

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.cpp
# Opt level: O2

int testingMul(void)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  size_t i;
  size_t res;
  allocator local_151;
  size_t local_150;
  size_t local_148;
  string local_140;
  long local_120;
  BN k_o;
  BN k_m;
  BN f_m;
  BN c_m;
  BN mul;
  BN bn1;
  BN bn2;
  size_t asStack_70 [8];
  
  lVar3 = 0;
  do {
    if (lVar3 == 0x40) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Multiple test: OK");
      std::endl<char,std::char_traits<char>>(poVar4);
      return 0;
    }
    local_148 = *(size_t *)((long)asStack_70 + lVar3);
    local_150 = *(size_t *)((long)asStack_70 + lVar3 + 8);
    i = 0;
    local_120 = lVar3;
    while( true ) {
      if ((int)i == 100000) break;
      iVar2 = rand();
      BN::makeRandom(&bn1,(long)(iVar2 % (int)local_148 + 1));
      iVar2 = rand();
      BN::makeRandom(&bn2,(long)(iVar2 % (int)local_150 + 1));
      BN::operator*(&mul,&bn1,&bn2);
      BN::classicMultiplication(&c_m,&bn1,&bn2);
      BN::fastMultiplication(&f_m,&bn1,&bn2);
      BN::karatsubaMultiplication(&k_m,&bn1,&bn2);
      BN::karatsubaMultiplication(&k_o,&bn1,&bn2);
      bVar1 = BN::operator!=(&mul,&c_m);
      if ((((bVar1) || (bVar1 = BN::operator!=(&mul,&f_m), bVar1)) ||
          (bVar1 = BN::operator!=(&mul,&k_m), bVar1)) || (bVar1 = BN::operator!=(&mul,&k_o), bVar1))
      {
        std::__cxx11::string::string((string *)&local_140,"bn1",&local_151);
        anon_unknown.dwarf_3964::printBN(&local_140,&bn1);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::string((string *)&local_140,"bn2",&local_151);
        anon_unknown.dwarf_3964::printBN(&local_140,&bn1);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::string((string *)&local_140,"bn1 * bn2 operator *",&local_151);
        anon_unknown.dwarf_3964::printBN(&local_140,&mul);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::string((string *)&local_140,"bn1 * bn2 classic",&local_151);
        anon_unknown.dwarf_3964::printBN(&local_140,&c_m);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::string((string *)&local_140,"bn1 * bn2 fast",&local_151);
        anon_unknown.dwarf_3964::printBN(&local_140,&f_m);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::string((string *)&local_140,"bn1 * bn2 karatsuba",&local_151);
        anon_unknown.dwarf_3964::printBN(&local_140,&k_m);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::string((string *)&local_140,"bn1 * bn2 karatsuba_o",&local_151);
        anon_unknown.dwarf_3964::printBN(&local_140,&k_o);
        std::__cxx11::string::~string((string *)&local_140);
        bVar1 = false;
        res = 1;
      }
      else {
        bVar1 = true;
        res = 0;
      }
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&k_o);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&k_m);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&f_m);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&c_m);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&mul);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&bn2);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&bn1);
      if (!bVar1) {
        std::__cxx11::string::string((string *)&local_140,"Multiplication",(allocator *)&bn1);
        anon_unknown.dwarf_3964::printTestError(&local_140,local_148,local_150,i,res);
        std::__cxx11::string::~string((string *)&local_140);
        return 1;
      }
      i = i + 1;
    }
    lVar3 = local_120 + 0x10;
  } while( true );
}

Assistant:

int testingMul() {
    for (auto sizes : defaultSizes()) {
        size_t max1 = sizes.first;
        size_t max2 = sizes.second;
        for(int i = 0; i < 100000; i++) {
            if (int res=testingMul_ij(max1, max2)) {
                printTestError("Multiplication", max1, max2, i, res);
                return res;
            }
        }
    }
    cout << "Multiple test: OK" << endl;
    return 0;
}